

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O3

void drmp3dec_f32_to_s16(float *in,drmp3_int16 *out,int num_samples)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar4 = _DAT_00112140;
  auVar3 = _DAT_00112130;
  if (0 < num_samples) {
    if ((num_samples & 0x7ffffff8U) == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        pfVar1 = in + uVar5;
        pfVar2 = in + uVar5 + 4;
        auVar7._0_4_ = *pfVar1 * 32768.0;
        auVar7._4_4_ = pfVar1[1] * 32768.0;
        auVar7._8_4_ = pfVar1[2] * 32768.0;
        auVar7._12_4_ = pfVar1[3] * 32768.0;
        auVar10._0_4_ = *pfVar2 * 32768.0;
        auVar10._4_4_ = pfVar2[1] * 32768.0;
        auVar10._8_4_ = pfVar2[2] * 32768.0;
        auVar10._12_4_ = pfVar2[3] * 32768.0;
        auVar7 = minps(auVar7,auVar3);
        auVar7 = maxps(auVar7,auVar4);
        auVar8._0_4_ = (int)auVar7._0_4_;
        auVar8._4_4_ = (int)auVar7._4_4_;
        auVar8._8_4_ = (int)auVar7._8_4_;
        auVar8._12_4_ = (int)auVar7._12_4_;
        auVar7 = minps(auVar10,auVar3);
        auVar7 = maxps(auVar7,auVar4);
        auVar11._0_4_ = (int)auVar7._0_4_;
        auVar11._4_4_ = (int)auVar7._4_4_;
        auVar11._8_4_ = (int)auVar7._8_4_;
        auVar11._12_4_ = (int)auVar7._12_4_;
        auVar7 = packssdw(auVar8,auVar11);
        *(undefined1 (*) [16])(out + uVar5) = auVar7;
        uVar5 = uVar5 + 8;
      } while (uVar5 < (num_samples & 0x7ffffff8U));
    }
    if ((int)uVar5 < num_samples) {
      uVar5 = uVar5 & 0xffffffff;
      do {
        fVar9 = in[uVar5] * 32768.0;
        sVar6 = 0x7fff;
        if ((fVar9 < 32766.5) && (sVar6 = -0x8000, -32767.5 < fVar9)) {
          sVar6 = (short)(int)(fVar9 + 0.5);
          sVar6 = (sVar6 >> 0xf) + sVar6;
        }
        out[uVar5] = sVar6;
        uVar5 = uVar5 + 1;
      } while ((uint)num_samples != uVar5);
    }
  }
  return;
}

Assistant:

void drmp3dec_f32_to_s16(const float *in, drmp3_int16 *out, int num_samples)
{
    if(num_samples > 0)
    {
        int i = 0;
#if DRMP3_HAVE_SIMD
        int aligned_count = num_samples & ~7;
        for(; i < aligned_count; i+=8)
        {
            static const drmp3_f4 g_scale = { 32768.0f, 32768.0f, 32768.0f, 32768.0f };
            drmp3_f4 a = DRMP3_VMUL(DRMP3_VLD(&in[i  ]), g_scale);
            drmp3_f4 b = DRMP3_VMUL(DRMP3_VLD(&in[i+4]), g_scale);
#if DRMP3_HAVE_SSE
            static const drmp3_f4 g_max = { 32767.0f, 32767.0f, 32767.0f, 32767.0f };
            static const drmp3_f4 g_min = { -32768.0f, -32768.0f, -32768.0f, -32768.0f };
            __m128i pcm8 = _mm_packs_epi32(_mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(a, g_max), g_min)),
                                           _mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(b, g_max), g_min)));
            out[i  ] = (drmp3_int16)_mm_extract_epi16(pcm8, 0);
            out[i+1] = (drmp3_int16)_mm_extract_epi16(pcm8, 1);
            out[i+2] = (drmp3_int16)_mm_extract_epi16(pcm8, 2);
            out[i+3] = (drmp3_int16)_mm_extract_epi16(pcm8, 3);
            out[i+4] = (drmp3_int16)_mm_extract_epi16(pcm8, 4);
            out[i+5] = (drmp3_int16)_mm_extract_epi16(pcm8, 5);
            out[i+6] = (drmp3_int16)_mm_extract_epi16(pcm8, 6);
            out[i+7] = (drmp3_int16)_mm_extract_epi16(pcm8, 7);
#else
            int16x4_t pcma, pcmb;
            a = DRMP3_VADD(a, DRMP3_VSET(0.5f));
            b = DRMP3_VADD(b, DRMP3_VSET(0.5f));
            pcma = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(a), vreinterpretq_s32_u32(vcltq_f32(a, DRMP3_VSET(0)))));
            pcmb = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(b), vreinterpretq_s32_u32(vcltq_f32(b, DRMP3_VSET(0)))));
            vst1_lane_s16(out+i  , pcma, 0);
            vst1_lane_s16(out+i+1, pcma, 1);
            vst1_lane_s16(out+i+2, pcma, 2);
            vst1_lane_s16(out+i+3, pcma, 3);
            vst1_lane_s16(out+i+4, pcmb, 0);
            vst1_lane_s16(out+i+5, pcmb, 1);
            vst1_lane_s16(out+i+6, pcmb, 2);
            vst1_lane_s16(out+i+7, pcmb, 3);
#endif
        }
#endif
        for(; i < num_samples; i++)
        {
            float sample = in[i] * 32768.0f;
            if (sample >=  32766.5)
                out[i] = (drmp3_int16) 32767;
            else if (sample <= -32767.5)
                out[i] = (drmp3_int16)-32768;
            else
            {
                short s = (drmp3_int16)(sample + .5f);
                s -= (s < 0);   /* away from zero, to be compliant */
                out[i] = s;
            }
        }
    }
}